

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  int local_e8;
  LogFinisher local_e2;
  byte local_e1;
  int i;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_18;
  int local_14;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_51 = 0;
  local_18 = num;
  local_14 = start;
  _num_local = this;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x797);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (local_18 < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x798);
    local_a1 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_a2,pLVar3);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  iVar1 = local_14 + local_18;
  iVar2 = size(this);
  local_e1 = 0;
  if (iVar2 < iVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x799);
    local_e1 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&i,"CHECK failed: (start + num) <= (size()): ");
    internal::LogFinisher::operator=(&local_e2,pLVar3);
  }
  if ((local_e1 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  for (local_e8 = 0; local_e8 < local_18; local_e8 = local_e8 + 1) {
    internal::RepeatedPtrFieldBase::
    Delete<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&this->super_RepeatedPtrFieldBase,local_14 + local_e8);
  }
  ExtractSubrange(this,local_14,local_18,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());
  for (int i = 0; i < num; ++i) {
    RepeatedPtrFieldBase::Delete<TypeHandler>(start + i);
  }
  ExtractSubrange(start, num, NULL);
}